

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O3

vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *
parse_device_list(vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                  *__return_storage_ptr__,string *value)

{
  pointer *pppgVar1;
  iterator __position;
  pointer pbVar2;
  int iVar3;
  vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *extraout_RAX;
  invalid_argument *piVar4;
  pointer pbVar5;
  ggml_backend_device *dev;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dev_names;
  ggml_backend_device *local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  string local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  string_split<std::__cxx11::string>(&local_60,value,',');
  if (local_60.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_60.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"no devices specified");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pbVar2 = local_60.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = local_60.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((long)local_60.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_60.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start == 0x20) &&
     (iVar3 = std::__cxx11::string::compare
                        ((char *)local_60.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start),
     pbVar2 = local_60.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start,
     pbVar5 = local_60.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish, iVar3 == 0)) {
    local_48._M_dataplus._M_p = (pointer)0x0;
    std::vector<ggml_backend_device*,std::allocator<ggml_backend_device*>>::
    emplace_back<ggml_backend_device*>
              ((vector<ggml_backend_device*,std::allocator<ggml_backend_device*>> *)
               __return_storage_ptr__,(ggml_backend_device **)&local_48);
  }
  else {
    for (; pbVar2 != pbVar5; pbVar2 = pbVar2 + 1) {
      local_68 = (ggml_backend_device *)ggml_backend_dev_by_name((pbVar2->_M_dataplus)._M_p);
      if ((local_68 == (ggml_backend_device *)0x0) ||
         (iVar3 = ggml_backend_dev_type(local_68), iVar3 != 1)) {
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
        string_format_abi_cxx11_(&local_48,"invalid device: %s",(pbVar2->_M_dataplus)._M_p);
        std::invalid_argument::invalid_argument(piVar4,(string *)&local_48);
        __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>)._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<ggml_backend_device*,std::allocator<ggml_backend_device*>>::
        _M_realloc_insert<ggml_backend_device*const&>
                  ((vector<ggml_backend_device*,std::allocator<ggml_backend_device*>> *)
                   __return_storage_ptr__,__position,&local_68);
      }
      else {
        *__position._M_current = local_68;
        pppgVar1 = &(__return_storage_ptr__->
                    super__Vector_base<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppgVar1 = *pppgVar1 + 1;
      }
    }
    local_48._M_dataplus._M_p = (pointer)0x0;
    std::vector<ggml_backend_device*,std::allocator<ggml_backend_device*>>::
    emplace_back<ggml_backend_device*>
              ((vector<ggml_backend_device*,std::allocator<ggml_backend_device*>> *)
               __return_storage_ptr__,(ggml_backend_device **)&local_48);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60);
  return extraout_RAX;
}

Assistant:

static std::vector<ggml_backend_dev_t> parse_device_list(const std::string & value) {
    std::vector<ggml_backend_dev_t> devices;
    auto dev_names = string_split<std::string>(value, ',');
    if (dev_names.empty()) {
        throw std::invalid_argument("no devices specified");
    }
    if (dev_names.size() == 1 && dev_names[0] == "none") {
        devices.push_back(nullptr);
    } else {
        for (const auto & device : dev_names) {
            auto * dev = ggml_backend_dev_by_name(device.c_str());
            if (!dev || ggml_backend_dev_type(dev) != GGML_BACKEND_DEVICE_TYPE_GPU) {
                throw std::invalid_argument(string_format("invalid device: %s", device.c_str()));
            }
            devices.push_back(dev);
        }
        devices.push_back(nullptr);
    }
    return devices;
}